

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O0

bool find_in_list(Am_Value *list_value,int ID)

{
  byte bVar1;
  Am_Value_List local_30 [8];
  Am_Value_List list;
  int ID_local;
  Am_Value *list_value_local;
  
  bVar1 = Am_Value::Valid();
  if ((bVar1 & 1) == 0) {
    list_value_local._7_1_ = false;
  }
  else {
    Am_Value_List::Am_Value_List(local_30,(Am_Value *)list_value);
    Am_Value_List::Start();
    bVar1 = Am_Value_List::Member((int)local_30);
    list_value_local._7_1_ = (bool)(bVar1 & 1);
    Am_Value_List::~Am_Value_List(local_30);
  }
  return list_value_local._7_1_;
}

Assistant:

bool
find_in_list(Am_Value list_value, int ID)
{
  if (!list_value.Valid())
    return false;                  // nothing selected
  Am_Value_List list = list_value; // otherwise it is a value list
  list.Start();
  return list.Member(ID);
}